

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3983::assert_vector_equal
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *lhs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *rhs)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  
  _assert_int_equal((long)(lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3,
                    (long)(rhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(rhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x11);
  puVar1 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    uVar3 = 0;
    do {
      if (puVar1[uVar3] !=
          (rhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar3]) {
        printf("Mismatch at %zu\n",uVar3);
        _assert_int_equal((lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start[uVar3],
                          (rhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start[uVar3],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                          ,0x15);
        puVar1 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar2 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)puVar2 - (long)puVar1 >> 3));
  }
  return;
}

Assistant:

void assert_vector_equal(const std::vector<uint64_t>& lhs,
                         const std::vector<uint64_t>& rhs) {
    assert_int_equal(lhs.size(), rhs.size());
    for (size_t i = 0; i < lhs.size(); ++i) {
        if (lhs[i] != rhs[i]) {
            printf("Mismatch at %zu\n", i);
            assert_int_equal(lhs[i], rhs[i]);
        }
    }
}